

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O1

void __thiscall
IteratedExprTest_Test_Test<PairwiseInfo>::TestBody(IteratedExprTest_Test_Test<PairwiseInfo> *this)

{
  bool bVar1;
  Impl *pIVar2;
  char *pcVar3;
  int i;
  long lVar4;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
  builder;
  Arg arg;
  AssertionResult gtest_ar;
  Expr e;
  ExprFactory factory;
  TestArgs<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> args;
  AssertHelper local_e0;
  AssertionResult local_d8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  long local_b8 [2];
  AssertHelper local_a8;
  ExprBase local_a0;
  AssertHelper local_98;
  undefined1 local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  pointer ppIStack_80;
  pointer local_78;
  pointer ppIStack_70;
  pointer local_68;
  pointer ppIStack_60;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
  local_58;
  TestArgs<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> local_48;
  
  local_a0.impl_ = (Impl *)0x0;
  local_90[0] = 1;
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90 = (undefined1  [8])&PTR__BasicExprFactory_001a92a0;
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  ppIStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  ppIStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  ppIStack_60 = (pointer)0x0;
  TestArgs<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::TestArgs
            (&local_48,(ExprFactory *)local_90);
  local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)&local_88,(Impl **)&local_c8);
  local_58.impl_ = (Impl *)operator_new__(0x100);
  ((local_58.impl_)->super_Impl).kind_ = ALLDIFF;
  ppIStack_80[-1] = (Impl *)local_58.impl_;
  (local_58.impl_)->num_args = 3;
  local_58.arg_index_ = 0;
  lVar4 = 0;
  do {
    mp::BasicExprFactory<std::allocator<char>_>::
    BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
    ::AddArg(&local_58,(Arg)local_48.args[lVar4].super_ExprBase.impl_);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  builder.arg_index_ = local_58.arg_index_;
  builder.impl_ = local_58.impl_;
  builder._12_4_ = 0;
  local_a0.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>>::
               EndIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
                         ((BasicExprFactory<std::allocator<char>> *)local_90,builder);
  local_d8._0_4_ = 0x44;
  local_a8.data_._0_4_ = (local_a0.impl_)->kind_;
  testing::internal::CmpHelperEQ<mp::expr::Kind,mp::expr::Kind>
            ((internal *)&local_c8,"info.kind()","e.kind()",(Kind *)&local_d8,(Kind *)&local_a8);
  if (local_c8.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x240
               ,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((Impl *)local_d8._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_d8._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_d8._0_8_ + 8))();
      }
      local_d8._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8._0_4_ = 3;
  local_a8.data_._0_4_ = local_a0.impl_[1].kind_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_c8,"3","e.num_args()",(int *)&local_d8,(int *)&local_a8);
  if (local_c8.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x241
               ,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((Impl *)local_d8._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_d8._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_d8._0_8_ + 8))();
      }
      local_d8._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8.data_ = (AssertHelperData *)(local_a0.impl_ + 2);
  lVar4 = 0;
  do {
    local_d8._0_8_ =
         mp::
         BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
         ::arg((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
                *)&local_a0,(int)lVar4);
    local_e0.data_ = (AssertHelperData *)local_48.args[lVar4].super_ExprBase.impl_;
    testing::internal::
    CmpHelperEQ<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              ((internal *)&local_c8,"args[i]","arg",
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_e0,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_d8);
    if (local_c8.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_e0);
      pcVar3 = "";
      if (local_c0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = ((local_c0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",
                 0x245,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_e0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_e0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_e0.data_ + 8))();
        }
        local_e0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_e0.data_ = (AssertHelperData *)local_48.args[lVar4].super_ExprBase.impl_;
    local_98.data_ =
         (AssertHelperData *)
         mp::internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                   (*(Impl **)local_a8.data_);
    testing::internal::
    CmpHelperEQ<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              ((internal *)&local_c8,"args[i]","*it",
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_e0,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_98);
    if (local_c8.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_e0);
      pcVar3 = "";
      if (local_c0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = ((local_c0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",
                 0x246,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_e0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_e0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_e0.data_ + 8))();
        }
        local_e0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar4 = lVar4 + 1;
    local_a8.data_ = (AssertHelperData *)&(local_a8.data_)->file;
  } while (lVar4 != 3);
  local_d8._0_8_ = local_a0.impl_ + (long)(int)local_a0.impl_[1].kind_ * 2 + 2;
  testing::internal::
  CmpHelperEQ<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>,mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
            ((internal *)&local_c8,"e.end()","it",
             (ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)&local_d8,
             (ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)&local_a8);
  if (local_c8.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x248
               ,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((Impl *)local_d8._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_d8._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_d8._0_8_ + 8))();
      }
      local_d8._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_d8.success_ == true) {
    local_c8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"index out of bounds","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::
      BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
      ::arg((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
             *)&local_a0,-1);
    }
    testing::AssertionResult::operator<<
              (&local_d8,
               (char (*) [95])
               "Expected: e.arg(-1) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8) {
      operator_delete(local_c8.ptr_,local_b8[0] + 1);
    }
  }
  testing::Message::Message((Message *)&local_c8);
  if (local_d8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_d8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x249,
             pcVar3);
  testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  if (local_c8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_c8.ptr_ + 8))();
    }
    local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_d8.success_ == true) {
    local_c8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"index out of bounds","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::
      BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
      ::arg((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
             *)&local_a0,3);
    }
    testing::AssertionResult::operator<<
              (&local_d8,
               (char (*) [101])
               "Expected: e.arg(NUM_ARGS) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8) {
      operator_delete(local_c8.ptr_,local_b8[0] + 1);
    }
  }
  testing::Message::Message((Message *)&local_c8);
  if (local_d8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_d8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x24a,
             pcVar3);
  testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  if (local_c8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_c8.ptr_ + 8))();
    }
    local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_d8.success_ == true) {
    local_c8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"invalid number of arguments","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprFactory<std::allocator<char>>::
      BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
                ((BasicExprFactory<std::allocator<char>> *)local_90,ALLDIFF,-1);
    }
    testing::AssertionResult::operator<<
              (&local_d8,
               (char (*) [131])
               "Expected: info.BeginBuild(factory, info.min_args() - 1) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8) {
      operator_delete(local_c8.ptr_,local_b8[0] + 1);
    }
  }
  testing::Message::Message((Message *)&local_c8);
  if (local_d8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_d8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x24c,
             pcVar3);
  testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  if (local_c8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_c8.ptr_ + 8))();
    }
    local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)&local_88,(Impl **)&local_c8);
  pIVar2 = (Impl *)operator_new__(0x40);
  pIVar2->kind_ = ALLDIFF;
  ppIStack_80[-1] = pIVar2;
  pIVar2[1].kind_ = UNKNOWN;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            ((BasicExprFactory<std::allocator<char>_> *)local_90);
  return;
}

Assistant:

TYPED_TEST(IteratedExprTest, Test) {
  typename TypeParam::Expr e;
  EXPECT_TRUE(e == 0);
  (void)typename TypeParam::Base(e);
  ExprFactory factory;
  enum {NUM_ARGS = 3};
  TestArgs<typename TypeParam::Arg> args(factory);
  auto info = this->info_;
  typename TypeParam::Builder builder = info.BeginBuild(factory, NUM_ARGS);
  for (int i = info.min_args(); i < NUM_ARGS; ++i)
    builder.AddArg(args[i]);
  e = info.EndBuild(factory, builder);
  EXPECT_EQ(info.kind(), e.kind());
  EXPECT_EQ(3, e.num_args());
  typename TypeParam::Expr::iterator it = e.begin();
  for (int i = 0; i < NUM_ARGS; ++i, ++it) {
    typename TypeParam::Arg arg = e.arg(i);
    EXPECT_EQ(args[i], arg);
    EXPECT_EQ(args[i], *it);
  }
  EXPECT_EQ(e.end(), it);
  EXPECT_ASSERT(e.arg(-1), "index out of bounds");
  EXPECT_ASSERT(e.arg(NUM_ARGS), "index out of bounds");
  EXPECT_ASSERT(info.BeginBuild(factory, info.min_args() - 1),
                "invalid number of arguments");
  info.BeginBuild(factory, info.min_args());
}